

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

string * __thiscall
BCLog::Logger::LogLevelsString_abi_cxx11_(string *__return_storage_ptr__,Logger *this)

{
  bool bVar1;
  Level level;
  Level extraout_EDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint *puVar3;
  long in_FS_OFFSET;
  allocator_type local_a1;
  uint *local_a0;
  uint *local_98;
  long local_90;
  Level local_88 [4];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88[0] = Info;
  local_88[1] = Debug;
  local_88[2] = 0;
  std::vector<BCLog::Level,std::allocator<BCLog::Level>>::vector<BCLog::Level_const*,void>
            ((vector<BCLog::Level,std::allocator<BCLog::Level>> *)&local_a0,local_88,local_88 + 3,
             &local_a1);
  paVar2 = &local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar2;
  if (local_a0 == local_98) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    bVar1 = true;
    puVar3 = local_a0;
    do {
      level = (Level)paVar2;
      if (!bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_58,", ");
        level = extraout_EDX;
      }
      LogLevelToStr_abi_cxx11_(&local_78,(Logger *)(ulong)*puVar3,level);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_58,local_78._M_dataplus._M_p,local_78._M_string_length);
      paVar2 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        paVar2 = extraout_RDX_00;
      }
      puVar3 = puVar3 + 1;
      bVar1 = false;
    } while (puVar3 != local_98);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
      goto LAB_0016d3f9;
    }
  }
  (__return_storage_ptr__->field_2)._M_allocated_capacity =
       CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
  *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_58.field_2._8_8_;
LAB_0016d3f9:
  __return_storage_ptr__->_M_string_length = local_58._M_string_length;
  if (local_a0 != (uint *)0x0) {
    operator_delete(local_a0,local_90 - (long)local_a0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string BCLog::Logger::LogLevelsString() const
{
    const auto& levels = LogLevelsList();
    return Join(std::vector<BCLog::Level>{levels.begin(), levels.end()}, ", ", [](BCLog::Level level) { return LogLevelToStr(level); });
}